

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::Eval
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  JobManager *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
  *this_01;
  bool bVar7;
  Status SVar8;
  ssize_t sVar9;
  const_iterator cVar10;
  Value *pVVar11;
  char *pcVar12;
  char *pcVar13;
  Interpreter *pIVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *this_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  string local_2c8;
  writer write;
  Expression retExpr;
  undefined1 local_270 [72];
  uint64_t xpan;
  pointer pbStack_220;
  pointer local_218;
  pointer local_210;
  format_string_checker<char> *local_208;
  parse_func local_200 [1];
  writer write_7;
  int cancelData;
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  undefined1 local_198 [40];
  undefined1 local_170 [40];
  undefined1 local_148 [40];
  undefined1 local_120 [40];
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  retExpr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  retExpr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  retExpr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  LOCK();
  (this->mCancelCommand)._M_base._M_i = false;
  UNLOCK();
  do {
    sVar9 = read(this->mCancelPipe[0],&cancelData,4);
    this_01 = mEvaluatorMap_abi_cxx11_;
  } while (sVar9 != -1);
  utils::ToLower((string *)local_270,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>_>_>_>
           ::find(this_01,(key_type *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  if ((_Rb_tree_header *)cVar10._M_node ==
      &(mEvaluatorMap_abi_cxx11_->_M_impl).super__Rb_tree_header) {
    xpan = CONCAT44(xpan._4_4_,0xd);
    pbStack_220 = (pointer)0x28e93d;
    local_218 = (pointer)0x3d;
    local_210 = (pointer)0x100000000;
    local_200[0] = ::fmt::v10::detail::
                   parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar12 = "\'{}\' is not a valid command, type \'help\' to list all commands";
    write.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&xpan;
    local_208 = (format_string_checker<char> *)&xpan;
    while (pcVar12 != "") {
      cVar1 = *pcVar12;
      pcVar13 = pcVar12;
      while (cVar1 != '{') {
        pcVar13 = pcVar13 + 1;
        if (pcVar13 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()(&write,pcVar12,"");
          goto LAB_00200c47;
        }
        cVar1 = *pcVar13;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&write,pcVar12,pcVar13);
      pcVar12 = ::fmt::v10::detail::
                parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                          (pcVar13,"",
                           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&xpan);
    }
LAB_00200c47:
    pbVar3 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    xpan = (uint64_t)(pbVar3->_M_dataplus)._M_p;
    pbStack_220 = (pointer)pbVar3->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x3d;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&xpan;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_2c8,(v10 *)"\'{}\' is not a valid command, type \'help\' to list all commands"
               ,fmt,args);
    this_02 = (string *)(local_58 + 8);
    local_58._0_4_ = kInvalidCommand;
    std::__cxx11::string::string(this_02,(string *)&local_2c8);
    Value::Value((Value *)local_270,(Error *)local_58);
  }
  else {
    MultiNetCommandContext::Cleanup(&this->mContext);
    ReParseMultiNetworkSyntax((Error *)local_198,this,aExpr,&retExpr);
    Value::Value((Value *)local_270,(Error *)local_198);
    pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_270);
    EVar2 = (pVVar11->mError).mCode;
    Value::~Value((Value *)local_270);
    std::__cxx11::string::~string((string *)(local_198 + 8));
    if (EVar2 != kNone) goto LAB_00201240;
    pbVar3 = (this->mContext).mExportFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->mContext).mExportFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar4 - (long)pbVar3) < 0x21) {
      pbVar5 = (this->mContext).mImportFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (this->mContext).mImportFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pIVar14 = (Interpreter *)((long)pbVar6 - (long)pbVar5);
      if (pIVar14 < (Interpreter *)0x21) {
        if (pbVar4 == pbVar3) {
          if (pbVar6 == pbVar5) {
LAB_00201275:
            if (((this->mContext).mNwkAliases.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish ==
                 (this->mContext).mNwkAliases.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) &&
               ((this->mContext).mDomAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                (this->mContext).mDomAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)) {
              if ((this->mContext).mImportFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (this->mContext).mImportFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                xpan = 0;
                SVar8 = persistent_storage::Registry::GetCurrentNetworkXpan
                                  ((this->mRegistry).
                                   super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,&xpan);
                if (SVar8 != kSuccess) {
                  xpan = 0;
                }
                JobManager::AppendImport
                          ((Error *)local_1e8,
                           (this->mJobManager).
                           super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,xpan,&retExpr);
                Value::Value((Value *)local_270,(Error *)local_1e8);
                pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_270);
                EVar2 = (pVVar11->mError).mCode;
                Value::~Value((Value *)local_270);
                std::__cxx11::string::~string((string *)(local_1e8 + 8));
                if (EVar2 != kNone) goto LAB_00201240;
              }
              std::
              function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              ::operator()((Value *)local_270,
                           (function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                            *)(cVar10._M_node + 2),this,&retExpr);
              Value::operator=(__return_storage_ptr__,(Value *)local_270);
              Value::~Value((Value *)local_270);
              goto LAB_00201240;
            }
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x0;
            ValidateMultiNetworkSyntax
                      ((Value *)local_270,this,&retExpr,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&write);
            pIVar14 = (Interpreter *)local_270;
            pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)pIVar14);
            EVar2 = (pVVar11->mError).mCode;
            Value::~Value((Value *)pIVar14);
            if (EVar2 == kNone) {
              bVar7 = IsMultiJob(pIVar14,&retExpr);
              if (bVar7) {
                this_00 = (this->mJobManager).
                          super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
                bVar7 = MultiNetCommandContext::HasGroupAlias(&this->mContext);
                JobManager::PrepareJobs
                          ((Error *)local_1c0,this_00,&retExpr,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&write,bVar7);
                Value::Value((Value *)local_270,(Error *)local_1c0);
                pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_270);
                EVar2 = (pVVar11->mError).mCode;
                Value::~Value((Value *)local_270);
                std::__cxx11::string::~string((string *)(local_1c0 + 8));
                if (EVar2 == kNone) {
                  JobManager::RunJobs((this->mJobManager).
                                      super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
                  JobManager::CollectJobsValue
                            ((Value *)local_270,
                             (this->mJobManager).
                             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
LAB_002014f8:
                  Value::operator=(__return_storage_ptr__,(Value *)local_270);
                  Value::~Value((Value *)local_270);
                }
              }
              else {
                if ((this->mContext).mImportFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    (this->mContext).mImportFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  std::
                  function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                  ::operator()((Value *)local_270,
                               (function<ot::commissioner::Interpreter::Value_(ot::commissioner::Interpreter_*,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                                *)(cVar10._M_node + 2),this,&retExpr);
                  goto LAB_002014f8;
                }
                xpan = xpan & 0xffffffff00000000;
                pbStack_220 = (pointer)0x28ea1d;
                local_218 = (pointer)0x51;
                local_210 = (pointer)0x0;
                local_200[0] = (parse_func)0x0;
                pcVar12 = 
                "Import syntax is not supported in synchronous processing of multi-network command";
                local_208 = (format_string_checker<char> *)&xpan;
                write_7.handler_ = (format_string_checker<char> *)&xpan;
                while (pcVar12 != "") {
                  cVar1 = *pcVar12;
                  pcVar13 = pcVar12;
                  while (cVar1 != '{') {
                    pcVar13 = pcVar13 + 1;
                    if (pcVar13 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>
                      ::writer::operator()(&write_7,pcVar12,"");
                      goto LAB_0020145e;
                    }
                    cVar1 = *pcVar13;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()(&write_7,pcVar12,pcVar13);
                  pcVar12 = ::fmt::v10::detail::
                            parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                      (pcVar13,"",(format_string_checker<char> *)&xpan);
                }
LAB_0020145e:
                args_06.field_1.args_ = in_R9.args_;
                args_06.desc_ = (unsigned_long_long)&xpan;
                ::fmt::v10::vformat_abi_cxx11_
                          (&local_2c8,
                           (v10 *)
                           "Import syntax is not supported in synchronous processing of multi-network command"
                           ,(string_view)ZEXT816(0x51),args_06);
                local_170._0_4_ = kInvalidArgs;
                std::__cxx11::string::string((string *)(local_170 + 8),(string *)&local_2c8);
                Value::Value((Value *)local_270,(Error *)local_170);
                Value::operator=(__return_storage_ptr__,(Value *)local_270);
                Value::~Value((Value *)local_270);
                std::__cxx11::string::~string((string *)(local_170 + 8));
                std::__cxx11::string::~string((string *)&local_2c8);
              }
            }
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&write);
            goto LAB_00201240;
          }
          bVar7 = IsFeatureSupported(pIVar14,mImportSyntax_abi_cxx11_,&retExpr);
          if (bVar7) {
            if ((this->mContext).mExportFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                (this->mContext).mExportFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              JobManager::SetImportFile
                        ((this->mJobManager).
                         super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(this->mContext).mImportFiles.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              goto LAB_00201275;
            }
            xpan = (ulong)xpan._4_4_ << 0x20;
            pbStack_220 = (pointer)0x28e9f0;
            local_218 = (pointer)0x2c;
            local_210 = (pointer)0x0;
            local_200[0] = (parse_func)0x0;
            pcVar12 = "--export and --import are mutually exclusive";
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&xpan;
            local_208 = (format_string_checker<char> *)&xpan;
            while (pcVar12 != "") {
              cVar1 = *pcVar12;
              pcVar13 = pcVar12;
              while (cVar1 != '{') {
                pcVar13 = pcVar13 + 1;
                if (pcVar13 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()((writer *)&write,pcVar12,"");
                  goto LAB_002011c4;
                }
                cVar1 = *pcVar13;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&write,pcVar12,pcVar13);
              pcVar12 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar13,"",(format_string_checker<char> *)&xpan);
            }
LAB_002011c4:
            args_05.field_1.args_ = in_R9.args_;
            args_05.desc_ = (unsigned_long_long)&xpan;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_2c8,(v10 *)"--export and --import are mutually exclusive",
                       (string_view)ZEXT816(0x2c),args_05);
            this_02 = (string *)(local_148 + 8);
            local_148._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(this_02,(string *)&local_2c8);
            Value::Value((Value *)local_270,(Error *)local_148);
          }
          else {
            xpan = CONCAT44(xpan._4_4_,0xc);
            pbStack_220 = (pointer)0x28e9cb;
            local_218 = (pointer)0x24;
            local_210 = (pointer)0x100000000;
            local_200[0] = ::fmt::v10::detail::
                           parse_format_specs<char[9],fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar12 = "\'{}\' is not supported by the command";
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&xpan;
            local_208 = (format_string_checker<char> *)&xpan;
            while (pcVar12 != "") {
              cVar1 = *pcVar12;
              pcVar13 = pcVar12;
              while (cVar1 != '{') {
                pcVar13 = pcVar13 + 1;
                if (pcVar13 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[9]>_>
                  ::writer::operator()((writer *)&write,pcVar12,"");
                  goto LAB_00201151;
                }
                cVar1 = *pcVar13;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[9]>_>
              ::writer::operator()((writer *)&write,pcVar12,pcVar13);
              pcVar12 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[9]>&>
                                  (pcVar13,"",(format_string_checker<char> *)&xpan);
            }
LAB_00201151:
            xpan = (long)"opdataset set active --import" + 0x15;
            fmt_01.size_ = 0xc;
            fmt_01.data_ = (char *)0x24;
            args_04.field_1.values_ = in_R9.values_;
            args_04.desc_ = (unsigned_long_long)&xpan;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_2c8,(v10 *)"\'{}\' is not supported by the command",fmt_01,args_04);
            this_02 = (string *)(local_120 + 8);
            local_120._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(this_02,(string *)&local_2c8);
            Value::Value((Value *)local_270,(Error *)local_120);
          }
        }
        else {
          bVar7 = IsFeatureSupported(pIVar14,mExportSyntax_abi_cxx11_,&retExpr);
          if (bVar7) {
            if ((this->mContext).mImportFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                (this->mContext).mImportFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) goto LAB_00201275;
            xpan = (ulong)xpan._4_4_ << 0x20;
            pbStack_220 = (pointer)0x28e9f0;
            local_218 = (pointer)0x2c;
            local_210 = (pointer)0x0;
            local_200[0] = (parse_func)0x0;
            pcVar12 = "--export and --import are mutually exclusive";
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&xpan;
            local_208 = (format_string_checker<char> *)&xpan;
            while (pcVar12 != "") {
              cVar1 = *pcVar12;
              pcVar13 = pcVar12;
              while (cVar1 != '{') {
                pcVar13 = pcVar13 + 1;
                if (pcVar13 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                  writer::operator()((writer *)&write,pcVar12,"");
                  goto LAB_00201054;
                }
                cVar1 = *pcVar13;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&write,pcVar12,pcVar13);
              pcVar12 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar13,"",(format_string_checker<char> *)&xpan);
            }
LAB_00201054:
            args_03.field_1.args_ = in_R9.args_;
            args_03.desc_ = (unsigned_long_long)&xpan;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_2c8,(v10 *)"--export and --import are mutually exclusive",
                       (string_view)ZEXT816(0x2c),args_03);
            this_02 = (string *)(local_f8 + 8);
            local_f8._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(this_02,(string *)&local_2c8);
            Value::Value((Value *)local_270,(Error *)local_f8);
          }
          else {
            xpan = CONCAT44(xpan._4_4_,0xc);
            pbStack_220 = (pointer)0x28e9cb;
            local_218 = (pointer)0x24;
            local_210 = (pointer)0x100000000;
            local_200[0] = ::fmt::v10::detail::
                           parse_format_specs<char[9],fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar12 = "\'{}\' is not supported by the command";
            write.handler_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&xpan;
            local_208 = (format_string_checker<char> *)&xpan;
            while (pcVar12 != "") {
              cVar1 = *pcVar12;
              pcVar13 = pcVar12;
              while (cVar1 != '{') {
                pcVar13 = pcVar13 + 1;
                if (pcVar13 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[9]>_>
                  ::writer::operator()((writer *)&write,pcVar12,"");
                  goto LAB_00200fde;
                }
                cVar1 = *pcVar13;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[9]>_>
              ::writer::operator()((writer *)&write,pcVar12,pcVar13);
              pcVar12 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[9]>&>
                                  (pcVar13,"",(format_string_checker<char> *)&xpan);
            }
LAB_00200fde:
            xpan = (long)"br scan --export" + 8;
            fmt_00.size_ = 0xc;
            fmt_00.data_ = (char *)0x24;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&xpan;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_2c8,(v10 *)"\'{}\' is not supported by the command",fmt_00,args_02);
            this_02 = (string *)(local_d0 + 8);
            local_d0._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(this_02,(string *)&local_2c8);
            Value::Value((Value *)local_270,(Error *)local_d0);
          }
        }
      }
      else {
        xpan = (ulong)xpan._4_4_ << 0x20;
        pbStack_220 = (pointer)0x28e9a3;
        local_218 = (pointer)0x27;
        local_210 = (pointer)0x0;
        local_200[0] = (parse_func)0x0;
        pcVar12 = "multiple files not allowed for --import";
        write.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&xpan;
        local_208 = (format_string_checker<char> *)&xpan;
        while (pcVar12 != "") {
          cVar1 = *pcVar12;
          pcVar13 = pcVar12;
          while (cVar1 != '{') {
            pcVar13 = pcVar13 + 1;
            if (pcVar13 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()((writer *)&write,pcVar12,"");
              goto LAB_00200e29;
            }
            cVar1 = *pcVar13;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&write,pcVar12,pcVar13);
          pcVar12 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar13,"",(format_string_checker<char> *)&xpan);
        }
LAB_00200e29:
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&xpan;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_2c8,(v10 *)"multiple files not allowed for --import",
                   (string_view)ZEXT816(0x27),args_01);
        this_02 = (string *)(local_a8 + 8);
        local_a8._0_4_ = kInvalidArgs;
        std::__cxx11::string::string(this_02,(string *)&local_2c8);
        Value::Value((Value *)local_270,(Error *)local_a8);
      }
    }
    else {
      xpan = (ulong)xpan._4_4_ << 0x20;
      pbStack_220 = (pointer)0x28e97b;
      local_218 = (pointer)0x27;
      local_210 = (pointer)0x0;
      local_200[0] = (parse_func)0x0;
      pcVar12 = "multiple files not allowed for --export";
      write.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&xpan;
      local_208 = (format_string_checker<char> *)&xpan;
      while (pcVar12 != "") {
        cVar1 = *pcVar12;
        pcVar13 = pcVar12;
        while (cVar1 != '{') {
          pcVar13 = pcVar13 + 1;
          if (pcVar13 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&write,pcVar12,"");
            goto LAB_00200d3e;
          }
          cVar1 = *pcVar13;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)&write,pcVar12,pcVar13);
        pcVar12 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar13,"",(format_string_checker<char> *)&xpan);
      }
LAB_00200d3e:
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&xpan;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_2c8,(v10 *)"multiple files not allowed for --export",
                 (string_view)ZEXT816(0x27),args_00);
      this_02 = (string *)(local_80 + 8);
      local_80._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(this_02,(string *)&local_2c8);
      Value::Value((Value *)local_270,(Error *)local_80);
    }
  }
  Value::operator=(__return_storage_ptr__,(Value *)local_270);
  Value::~Value((Value *)local_270);
  std::__cxx11::string::~string(this_02);
  std::__cxx11::string::~string((string *)&local_2c8);
LAB_00201240:
  JobManager::CleanupJobs
            ((this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&retExpr);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::Eval(const Expression &aExpr)
{
    Expression retExpr;
    bool       supported;
    Value      value;
    int        cancelData;

    mCancelCommand = false;
    // empty the pipe prior to starting command execution
    while (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) != -1)
        ;

    // make sure first the command is known
    auto evaluator = mEvaluatorMap.find(ToLower(aExpr.front()));
    if (evaluator == mEvaluatorMap.end())
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_COMMAND, aExpr.front()));
    }
    // prepare for parsing next command
    mContext.Cleanup();

    SuccessOrExit(value = ReParseMultiNetworkSyntax(aExpr, retExpr));
    // export file specification must be single or omitted
    VerifyOrExit(mContext.mExportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_EXPORT));
    // import file specification must be single or omitted
    VerifyOrExit(mContext.mImportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_IMPORT));

    if (mContext.mExportFiles.size() > 0)
    {
        supported = IsFeatureSupported(mExportSyntax, retExpr);
        VerifyOrExit(supported, value = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_EXPORT));
        // export and import must not be specified simultaneously
        VerifyOrExit(mContext.mImportFiles.size() == 0, value = ERROR_INVALID_ARGS(SYNTAX_EXP_IMP_MUTUAL));
    }
    else if (mContext.mImportFiles.size() > 0)
    {
        supported = IsFeatureSupported(mImportSyntax, retExpr);
        VerifyOrExit(supported, value = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_IMPORT));
        // export and import must not be specified simultaneously
        VerifyOrExit(mContext.mExportFiles.size() == 0, value = ERROR_INVALID_ARGS(SYNTAX_EXP_IMP_MUTUAL));
        // let job manager take care of import data
        mJobManager->SetImportFile(mContext.mImportFiles.front());
    }

    if (mContext.mNwkAliases.size() > 0 || mContext.mDomAliases.size() > 0)
    {
        std::vector<uint64_t> nids;

        SuccessOrExit(value = ValidateMultiNetworkSyntax(retExpr, nids));
        if (IsMultiJob(retExpr)) // asynchronous processing required
        {
            SuccessOrExit(value = mJobManager->PrepareJobs(retExpr, nids, mContext.HasGroupAlias()));
            mJobManager->RunJobs();
            value = mJobManager->CollectJobsValue();
        }
        else // synchronous processing possible
        {
            // with multi-network syntax in effect an import semantics
            // is allowed for job-based processing only (see mImportSyntax)
            VerifyOrExit(mContext.mImportFiles.size() == 0,
                         value = ERROR_INVALID_ARGS(
                             "Import syntax is not supported in synchronous processing of multi-network command"));

            value = evaluator->second(this, retExpr);
        }
    }
    else
    {
        // handle single command using selected network
        if (mContext.mImportFiles.size() > 0)
        {
            uint64_t xpan = 0;
            if (mContext.mNwkAliases.empty())
            {
                auto result = mRegistry->GetCurrentNetworkXpan(xpan);
                if (result != Registry::Status::kSuccess)
                {
                    xpan = 0;
                }
            }
            else
            {
                std::vector<uint64_t> nwks;
                StringArray           unresolved;
                VerifyOrExit(mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, nwks, unresolved) ==
                                 Registry::Status::kSuccess,
                             value = ERROR_INVALID_ARGS("Failed to resolve network alias for import"));
                xpan = nwks[0];
            }
            SuccessOrExit(value = mJobManager->AppendImport(xpan, retExpr));
        }
        value = evaluator->second(this, retExpr);
    }
exit:
    // It is necessary to cleanup import file anyways
    mJobManager->CleanupJobs();
    return value;
}